

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

double __thiscall
ON_SubDVertex::Internal_InteriorCreaseVertexSharpnessForExperts(ON_SubDVertex *this)

{
  double local_20;
  ON_SubDVertex *this_local;
  
  if (this->m_vertex_tag == Crease) {
    local_20 = (double)this->m_interior_crease_vertex_sharpness;
  }
  else {
    local_20 = 0.0;
  }
  return local_20;
}

Assistant:

double ON_SubDVertex::Internal_InteriorCreaseVertexSharpnessForExperts() const
{
  // This function cannot check that this->IsInteriorCrease() is true because
  // this function is used on partial subsets of a SubD in low level evaluation code.
  // When a vertex is an interior crease in the complete SubD, these partial
  // SubD include only one of the sectors. Thus, all that can be checked is the
  // crease tag settings
  return (ON_SubDVertexTag::Crease == m_vertex_tag) ? m_interior_crease_vertex_sharpness : 0.0;
}